

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O1

int Abc_NtkMfsInterplateEval(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar2 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,0);
  uVar3 = *puVar2;
  uVar5 = uVar3;
  if (nCands == 6) {
    uVar5 = puVar2[1];
  }
  puVar2 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,1);
  uVar1 = ~*puVar2;
  if (nCands == 6) {
    uVar1 = ~puVar2[1];
  }
  uVar3 = uVar3 ^ ~*puVar2;
  uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar4 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  uVar3 = ((uVar1 ^ uVar5) >> 1 & 0x55555555) + ((uVar1 ^ uVar5) & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  return (uVar3 >> 0x10) + (uVar3 & 0xff) + (uVar4 >> 0x10) + (uVar4 & 0xff);
}

Assistant:

int Abc_NtkMfsInterplateEval( Mfs_Man_t * p, int * pCands, int nCands )
{
    unsigned * pTruth, uTruth0[2], uTruth1[2];
    int nCounter;
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 0 );
    if ( nCands == 6 )
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[1];
    }
    else
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[0];
    }
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 1 );
    if ( nCands == 6 )
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[1];
    }
    else
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[0];
    }
    nCounter  = Extra_WordCountOnes( uTruth0[0] ^ uTruth1[0] );
    nCounter += Extra_WordCountOnes( uTruth0[1] ^ uTruth1[1] );
//    printf( "%d ", nCounter );
    return nCounter;
}